

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VectorIO.cpp
# Opt level: O2

void amrex::writeIntData(int *data,size_t size,ostream *os,IntDescriptor *id)

{
  bool bVar1;
  int iVar2;
  IntDescriptor *id_00;
  
  id_00 = FPC::NativeIntDescriptor();
  bVar1 = IntDescriptor::operator==(id,id_00);
  if (bVar1) {
    std::ostream::write((char *)os,(long)data);
    return;
  }
  iVar2 = IntDescriptor::numBytes(id);
  if (iVar2 == 2) {
    writeIntData<short,int>(data,size,os,id);
    return;
  }
  iVar2 = IntDescriptor::numBytes(id);
  if (iVar2 == 4) {
    writeIntData<int,int>(data,size,os,id);
    return;
  }
  iVar2 = IntDescriptor::numBytes(id);
  if (iVar2 == 8) {
    writeIntData<long,int>(data,size,os,id);
    return;
  }
  Error_host("Don\'t know how to work with this integer type.");
  return;
}

Assistant:

void amrex::writeIntData (const int* data, std::size_t size, std::ostream& os,
                          const IntDescriptor& id)
{
    if (id == FPC::NativeIntDescriptor())
    {
        os.write((char*) data, size*sizeof(int));
    }
    else if (id.numBytes() == 2)
    {
        writeIntData<std::int16_t, int>(data, size, os, id);
    }
    else if (id.numBytes() == 4)
    {
        writeIntData<std::int32_t, int>(data, size, os, id);
    }
    else if (id.numBytes() == 8)
    {
        writeIntData<std::int64_t, int>(data, size, os, id);
    }
    else {
        amrex::Error("Don't know how to work with this integer type.");
    }
}